

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O2

void pdqsort_detail::
     sort2<__gnu_cxx::__normal_iterator<std::pair<int,double>*,std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>>,std::less<std::pair<int,double>>>
               (pair<int,_double> *a,pair<int,_double> *b)

{
  double dVar1;
  int iVar2;
  bool bVar3;
  
  bVar3 = std::operator<(b,a);
  if (bVar3) {
    iVar2 = a->first;
    a->first = b->first;
    b->first = iVar2;
    dVar1 = a->second;
    a->second = b->second;
    b->second = dVar1;
  }
  return;
}

Assistant:

inline void sort2(Iter a, Iter b, Compare comp) {
        if (comp(*b, *a)) std::iter_swap(a, b);
    }